

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9MemObjTryInteger(jx9_value *pObj)

{
  double dVar1;
  long in_RAX;
  jx9_real r;
  
  if ((pObj->iFlags & 4) != 0) {
    dVar1 = (pObj->x).rVal;
    in_RAX = (long)dVar1;
    if (9.223372036854776e+18 < ABS(dVar1)) {
      in_RAX = -0x8000000000000000;
    }
    if (in_RAX + 0x7fffffffffffffffU < 0xfffffffffffffffe && (double)in_RAX == dVar1) {
      (pObj->x).iVal = in_RAX;
      pObj->iFlags = 2;
    }
  }
  return (sxi32)in_RAX;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjTryInteger(jx9_value *pObj)
{
	if( pObj->iFlags & MEMOBJ_REAL ){
		/* Work only with reals */
		MemObjTryIntger(&(*pObj));
	}
	return SXRET_OK;
}